

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O0

void ncnn::convdw5x5s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined8 *puVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _k44;
  __m128 _k43;
  __m128 _k42;
  __m128 _k41;
  __m128 _k40;
  __m128 _r44;
  __m128 _r43;
  __m128 _r42;
  __m128 _r41;
  __m128 _r40;
  __m128 _k34;
  __m128 _k33;
  __m128 _k32;
  __m128 _k31;
  __m128 _k30;
  __m128 _r34;
  __m128 _r33;
  __m128 _r32;
  __m128 _r31;
  __m128 _r30;
  __m128 _k24;
  __m128 _k23;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _r24;
  __m128 _r23;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _k14;
  __m128 _k13;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _r14;
  __m128 _r13;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _k04;
  __m128 _k03;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  __m128 _r04;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_1358;
  undefined8 uStack_1350;
  int local_fe0;
  int local_fdc;
  undefined8 *local_fd8;
  undefined8 *local_fd0;
  undefined8 *local_fc8;
  undefined8 *local_fc0;
  undefined8 *local_fb8;
  undefined8 *local_f68;
  int local_eec;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  lVar6 = in_RDI[7];
  iVar7 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 4;
  lVar3 = *in_RCX;
  for (local_eec = 0; local_eec < (int)lVar6; local_eec = local_eec + 1) {
    local_f68 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_eec * in_RSI[2]);
    if (lVar3 == 0) {
      local_1358 = 0;
      uStack_1350 = 0;
    }
    else {
      puVar8 = (undefined8 *)(lVar3 + (long)(local_eec << 2) * 4);
      local_1358 = *puVar8;
      uStack_1350 = puVar8[1];
    }
    puVar8 = (undefined8 *)
             (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_eec * in_RDX[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    local_fb8 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_eec * in_RDI[2]);
    lVar4 = in_RDI[2];
    local_fc0 = (undefined8 *)((long)local_fb8 + iVar2 * lVar4);
    local_fc8 = (undefined8 *)((long)local_fb8 + (long)iVar2 * 2 * lVar4);
    local_fd0 = (undefined8 *)((long)local_fb8 + (long)iVar2 * 3 * lVar4);
    local_fd8 = (undefined8 *)((long)local_fb8 + (long)iVar2 * 4 * lVar4);
    for (local_fdc = 0; local_fdc < (int)lVar5; local_fdc = local_fdc + 1) {
      for (local_fe0 = 0; local_fe0 < iVar1; local_fe0 = local_fe0 + 1) {
        local_28 = (float)*puVar8;
        fStack_24 = (float)((ulong)*puVar8 >> 0x20);
        fStack_20 = (float)puVar8[1];
        fStack_1c = (float)((ulong)puVar8[1] >> 0x20);
        local_38 = (float)*local_fb8;
        fStack_34 = (float)((ulong)*local_fb8 >> 0x20);
        fStack_30 = (float)local_fb8[1];
        fStack_2c = (float)((ulong)local_fb8[1] >> 0x20);
        local_58 = (float)local_1358;
        fStack_54 = (float)((ulong)local_1358 >> 0x20);
        fStack_50 = (float)uStack_1350;
        fStack_4c = (float)((ulong)uStack_1350 >> 0x20);
        local_98 = (float)puVar8[2];
        fStack_94 = (float)((ulong)puVar8[2] >> 0x20);
        fStack_90 = (float)puVar8[3];
        fStack_8c = (float)((ulong)puVar8[3] >> 0x20);
        local_a8 = (float)local_fb8[2];
        fStack_a4 = (float)((ulong)local_fb8[2] >> 0x20);
        fStack_a0 = (float)local_fb8[3];
        fStack_9c = (float)((ulong)local_fb8[3] >> 0x20);
        local_108 = (float)puVar8[4];
        fStack_104 = (float)((ulong)puVar8[4] >> 0x20);
        fStack_100 = (float)puVar8[5];
        fStack_fc = (float)((ulong)puVar8[5] >> 0x20);
        local_118 = (float)local_fb8[4];
        fStack_114 = (float)((ulong)local_fb8[4] >> 0x20);
        fStack_110 = (float)local_fb8[5];
        fStack_10c = (float)((ulong)local_fb8[5] >> 0x20);
        local_178 = (float)puVar8[6];
        fStack_174 = (float)((ulong)puVar8[6] >> 0x20);
        fStack_170 = (float)puVar8[7];
        fStack_16c = (float)((ulong)puVar8[7] >> 0x20);
        local_188 = (float)local_fb8[6];
        fStack_184 = (float)((ulong)local_fb8[6] >> 0x20);
        fStack_180 = (float)local_fb8[7];
        fStack_17c = (float)((ulong)local_fb8[7] >> 0x20);
        local_1e8 = (float)puVar8[8];
        fStack_1e4 = (float)((ulong)puVar8[8] >> 0x20);
        fStack_1e0 = (float)puVar8[9];
        fStack_1dc = (float)((ulong)puVar8[9] >> 0x20);
        local_1f8 = (float)local_fb8[8];
        fStack_1f4 = (float)((ulong)local_fb8[8] >> 0x20);
        fStack_1f0 = (float)local_fb8[9];
        fStack_1ec = (float)((ulong)local_fb8[9] >> 0x20);
        local_258 = (float)puVar8[10];
        fStack_254 = (float)((ulong)puVar8[10] >> 0x20);
        fStack_250 = (float)puVar8[0xb];
        fStack_24c = (float)((ulong)puVar8[0xb] >> 0x20);
        local_268 = (float)*local_fc0;
        fStack_264 = (float)((ulong)*local_fc0 >> 0x20);
        fStack_260 = (float)local_fc0[1];
        fStack_25c = (float)((ulong)local_fc0[1] >> 0x20);
        local_2c8 = (float)puVar8[0xc];
        fStack_2c4 = (float)((ulong)puVar8[0xc] >> 0x20);
        fStack_2c0 = (float)puVar8[0xd];
        fStack_2bc = (float)((ulong)puVar8[0xd] >> 0x20);
        local_2d8 = (float)local_fc0[2];
        fStack_2d4 = (float)((ulong)local_fc0[2] >> 0x20);
        fStack_2d0 = (float)local_fc0[3];
        fStack_2cc = (float)((ulong)local_fc0[3] >> 0x20);
        local_338 = (float)puVar8[0xe];
        fStack_334 = (float)((ulong)puVar8[0xe] >> 0x20);
        fStack_330 = (float)puVar8[0xf];
        fStack_32c = (float)((ulong)puVar8[0xf] >> 0x20);
        local_348 = (float)local_fc0[4];
        fStack_344 = (float)((ulong)local_fc0[4] >> 0x20);
        fStack_340 = (float)local_fc0[5];
        fStack_33c = (float)((ulong)local_fc0[5] >> 0x20);
        local_3a8 = (float)puVar8[0x10];
        fStack_3a4 = (float)((ulong)puVar8[0x10] >> 0x20);
        fStack_3a0 = (float)puVar8[0x11];
        fStack_39c = (float)((ulong)puVar8[0x11] >> 0x20);
        local_3b8 = (float)local_fc0[6];
        fStack_3b4 = (float)((ulong)local_fc0[6] >> 0x20);
        fStack_3b0 = (float)local_fc0[7];
        fStack_3ac = (float)((ulong)local_fc0[7] >> 0x20);
        local_418 = (float)puVar8[0x12];
        fStack_414 = (float)((ulong)puVar8[0x12] >> 0x20);
        fStack_410 = (float)puVar8[0x13];
        fStack_40c = (float)((ulong)puVar8[0x13] >> 0x20);
        local_428 = (float)local_fc0[8];
        fStack_424 = (float)((ulong)local_fc0[8] >> 0x20);
        fStack_420 = (float)local_fc0[9];
        fStack_41c = (float)((ulong)local_fc0[9] >> 0x20);
        local_488 = (float)puVar8[0x14];
        fStack_484 = (float)((ulong)puVar8[0x14] >> 0x20);
        fStack_480 = (float)puVar8[0x15];
        fStack_47c = (float)((ulong)puVar8[0x15] >> 0x20);
        local_498 = (float)*local_fc8;
        fStack_494 = (float)((ulong)*local_fc8 >> 0x20);
        fStack_490 = (float)local_fc8[1];
        fStack_48c = (float)((ulong)local_fc8[1] >> 0x20);
        local_4f8 = (float)puVar8[0x16];
        fStack_4f4 = (float)((ulong)puVar8[0x16] >> 0x20);
        fStack_4f0 = (float)puVar8[0x17];
        fStack_4ec = (float)((ulong)puVar8[0x17] >> 0x20);
        local_508 = (float)local_fc8[2];
        fStack_504 = (float)((ulong)local_fc8[2] >> 0x20);
        fStack_500 = (float)local_fc8[3];
        fStack_4fc = (float)((ulong)local_fc8[3] >> 0x20);
        local_568 = (float)puVar8[0x18];
        fStack_564 = (float)((ulong)puVar8[0x18] >> 0x20);
        fStack_560 = (float)puVar8[0x19];
        fStack_55c = (float)((ulong)puVar8[0x19] >> 0x20);
        local_578 = (float)local_fc8[4];
        fStack_574 = (float)((ulong)local_fc8[4] >> 0x20);
        fStack_570 = (float)local_fc8[5];
        fStack_56c = (float)((ulong)local_fc8[5] >> 0x20);
        local_5d8 = (float)puVar8[0x1a];
        fStack_5d4 = (float)((ulong)puVar8[0x1a] >> 0x20);
        fStack_5d0 = (float)puVar8[0x1b];
        fStack_5cc = (float)((ulong)puVar8[0x1b] >> 0x20);
        local_5e8 = (float)local_fc8[6];
        fStack_5e4 = (float)((ulong)local_fc8[6] >> 0x20);
        fStack_5e0 = (float)local_fc8[7];
        fStack_5dc = (float)((ulong)local_fc8[7] >> 0x20);
        local_648 = (float)puVar8[0x1c];
        fStack_644 = (float)((ulong)puVar8[0x1c] >> 0x20);
        fStack_640 = (float)puVar8[0x1d];
        fStack_63c = (float)((ulong)puVar8[0x1d] >> 0x20);
        local_658 = (float)local_fc8[8];
        fStack_654 = (float)((ulong)local_fc8[8] >> 0x20);
        fStack_650 = (float)local_fc8[9];
        fStack_64c = (float)((ulong)local_fc8[9] >> 0x20);
        local_6b8 = (float)puVar8[0x1e];
        fStack_6b4 = (float)((ulong)puVar8[0x1e] >> 0x20);
        fStack_6b0 = (float)puVar8[0x1f];
        fStack_6ac = (float)((ulong)puVar8[0x1f] >> 0x20);
        local_6c8 = (float)*local_fd0;
        fStack_6c4 = (float)((ulong)*local_fd0 >> 0x20);
        fStack_6c0 = (float)local_fd0[1];
        fStack_6bc = (float)((ulong)local_fd0[1] >> 0x20);
        local_728 = (float)puVar8[0x20];
        fStack_724 = (float)((ulong)puVar8[0x20] >> 0x20);
        fStack_720 = (float)puVar8[0x21];
        fStack_71c = (float)((ulong)puVar8[0x21] >> 0x20);
        local_738 = (float)local_fd0[2];
        fStack_734 = (float)((ulong)local_fd0[2] >> 0x20);
        fStack_730 = (float)local_fd0[3];
        fStack_72c = (float)((ulong)local_fd0[3] >> 0x20);
        local_798 = (float)puVar8[0x22];
        fStack_794 = (float)((ulong)puVar8[0x22] >> 0x20);
        fStack_790 = (float)puVar8[0x23];
        fStack_78c = (float)((ulong)puVar8[0x23] >> 0x20);
        local_7a8 = (float)local_fd0[4];
        fStack_7a4 = (float)((ulong)local_fd0[4] >> 0x20);
        fStack_7a0 = (float)local_fd0[5];
        fStack_79c = (float)((ulong)local_fd0[5] >> 0x20);
        local_808 = (float)puVar8[0x24];
        fStack_804 = (float)((ulong)puVar8[0x24] >> 0x20);
        fStack_800 = (float)puVar8[0x25];
        fStack_7fc = (float)((ulong)puVar8[0x25] >> 0x20);
        local_818 = (float)local_fd0[6];
        fStack_814 = (float)((ulong)local_fd0[6] >> 0x20);
        fStack_810 = (float)local_fd0[7];
        fStack_80c = (float)((ulong)local_fd0[7] >> 0x20);
        local_878 = (float)puVar8[0x26];
        fStack_874 = (float)((ulong)puVar8[0x26] >> 0x20);
        fStack_870 = (float)puVar8[0x27];
        fStack_86c = (float)((ulong)puVar8[0x27] >> 0x20);
        local_888 = (float)local_fd0[8];
        fStack_884 = (float)((ulong)local_fd0[8] >> 0x20);
        fStack_880 = (float)local_fd0[9];
        fStack_87c = (float)((ulong)local_fd0[9] >> 0x20);
        local_8e8 = (float)puVar8[0x28];
        fStack_8e4 = (float)((ulong)puVar8[0x28] >> 0x20);
        fStack_8e0 = (float)puVar8[0x29];
        fStack_8dc = (float)((ulong)puVar8[0x29] >> 0x20);
        local_8f8 = (float)*local_fd8;
        fStack_8f4 = (float)((ulong)*local_fd8 >> 0x20);
        fStack_8f0 = (float)local_fd8[1];
        fStack_8ec = (float)((ulong)local_fd8[1] >> 0x20);
        local_958 = (float)puVar8[0x2a];
        fStack_954 = (float)((ulong)puVar8[0x2a] >> 0x20);
        fStack_950 = (float)puVar8[0x2b];
        fStack_94c = (float)((ulong)puVar8[0x2b] >> 0x20);
        local_968 = (float)local_fd8[2];
        fStack_964 = (float)((ulong)local_fd8[2] >> 0x20);
        fStack_960 = (float)local_fd8[3];
        fStack_95c = (float)((ulong)local_fd8[3] >> 0x20);
        local_9c8 = (float)puVar8[0x2c];
        fStack_9c4 = (float)((ulong)puVar8[0x2c] >> 0x20);
        fStack_9c0 = (float)puVar8[0x2d];
        fStack_9bc = (float)((ulong)puVar8[0x2d] >> 0x20);
        local_9d8 = (float)local_fd8[4];
        fStack_9d4 = (float)((ulong)local_fd8[4] >> 0x20);
        fStack_9d0 = (float)local_fd8[5];
        fStack_9cc = (float)((ulong)local_fd8[5] >> 0x20);
        local_a38 = (float)puVar8[0x2e];
        fStack_a34 = (float)((ulong)puVar8[0x2e] >> 0x20);
        fStack_a30 = (float)puVar8[0x2f];
        fStack_a2c = (float)((ulong)puVar8[0x2f] >> 0x20);
        local_a48 = (float)local_fd8[6];
        fStack_a44 = (float)((ulong)local_fd8[6] >> 0x20);
        fStack_a40 = (float)local_fd8[7];
        fStack_a3c = (float)((ulong)local_fd8[7] >> 0x20);
        local_aa8 = (float)puVar8[0x30];
        fStack_aa4 = (float)((ulong)puVar8[0x30] >> 0x20);
        fStack_aa0 = (float)puVar8[0x31];
        fStack_a9c = (float)((ulong)puVar8[0x31] >> 0x20);
        local_ab8 = (float)local_fd8[8];
        fStack_ab4 = (float)((ulong)local_fd8[8] >> 0x20);
        fStack_ab0 = (float)local_fd8[9];
        fStack_aac = (float)((ulong)local_fd8[9] >> 0x20);
        *local_f68 = CONCAT44(fStack_aa4 * fStack_ab4 +
                              fStack_a34 * fStack_a44 +
                              fStack_9c4 * fStack_9d4 +
                              fStack_954 * fStack_964 +
                              fStack_8e4 * fStack_8f4 +
                              fStack_874 * fStack_884 +
                              fStack_804 * fStack_814 +
                              fStack_794 * fStack_7a4 +
                              fStack_724 * fStack_734 +
                              fStack_6b4 * fStack_6c4 +
                              fStack_644 * fStack_654 +
                              fStack_5d4 * fStack_5e4 +
                              fStack_564 * fStack_574 +
                              fStack_4f4 * fStack_504 +
                              fStack_484 * fStack_494 +
                              fStack_414 * fStack_424 +
                              fStack_3a4 * fStack_3b4 +
                              fStack_334 * fStack_344 +
                              fStack_2c4 * fStack_2d4 +
                              fStack_254 * fStack_264 +
                              fStack_1e4 * fStack_1f4 +
                              fStack_174 * fStack_184 +
                              fStack_104 * fStack_114 +
                              fStack_94 * fStack_a4 + fStack_24 * fStack_34 + fStack_54,
                              local_aa8 * local_ab8 +
                              local_a38 * local_a48 +
                              local_9c8 * local_9d8 +
                              local_958 * local_968 +
                              local_8e8 * local_8f8 +
                              local_878 * local_888 +
                              local_808 * local_818 +
                              local_798 * local_7a8 +
                              local_728 * local_738 +
                              local_6b8 * local_6c8 +
                              local_648 * local_658 +
                              local_5d8 * local_5e8 +
                              local_568 * local_578 +
                              local_4f8 * local_508 +
                              local_488 * local_498 +
                              local_418 * local_428 +
                              local_3a8 * local_3b8 +
                              local_338 * local_348 +
                              local_2c8 * local_2d8 +
                              local_258 * local_268 +
                              local_1e8 * local_1f8 +
                              local_178 * local_188 +
                              local_108 * local_118 +
                              local_98 * local_a8 + local_28 * local_38 + local_58);
        local_f68[1] = CONCAT44(fStack_a9c * fStack_aac +
                                fStack_a2c * fStack_a3c +
                                fStack_9bc * fStack_9cc +
                                fStack_94c * fStack_95c +
                                fStack_8dc * fStack_8ec +
                                fStack_86c * fStack_87c +
                                fStack_7fc * fStack_80c +
                                fStack_78c * fStack_79c +
                                fStack_71c * fStack_72c +
                                fStack_6ac * fStack_6bc +
                                fStack_63c * fStack_64c +
                                fStack_5cc * fStack_5dc +
                                fStack_55c * fStack_56c +
                                fStack_4ec * fStack_4fc +
                                fStack_47c * fStack_48c +
                                fStack_40c * fStack_41c +
                                fStack_39c * fStack_3ac +
                                fStack_32c * fStack_33c +
                                fStack_2bc * fStack_2cc +
                                fStack_24c * fStack_25c +
                                fStack_1dc * fStack_1ec +
                                fStack_16c * fStack_17c +
                                fStack_fc * fStack_10c +
                                fStack_8c * fStack_9c + fStack_1c * fStack_2c + fStack_4c,
                                fStack_aa0 * fStack_ab0 +
                                fStack_a30 * fStack_a40 +
                                fStack_9c0 * fStack_9d0 +
                                fStack_950 * fStack_960 +
                                fStack_8e0 * fStack_8f0 +
                                fStack_870 * fStack_880 +
                                fStack_800 * fStack_810 +
                                fStack_790 * fStack_7a0 +
                                fStack_720 * fStack_730 +
                                fStack_6b0 * fStack_6c0 +
                                fStack_640 * fStack_650 +
                                fStack_5d0 * fStack_5e0 +
                                fStack_560 * fStack_570 +
                                fStack_4f0 * fStack_500 +
                                fStack_480 * fStack_490 +
                                fStack_410 * fStack_420 +
                                fStack_3a0 * fStack_3b0 +
                                fStack_330 * fStack_340 +
                                fStack_2c0 * fStack_2d0 +
                                fStack_250 * fStack_260 +
                                fStack_1e0 * fStack_1f0 +
                                fStack_170 * fStack_180 +
                                fStack_100 * fStack_110 +
                                fStack_90 * fStack_a0 + fStack_20 * fStack_30 + fStack_50);
        local_f68 = local_f68 + 2;
        local_fb8 = local_fb8 + 4;
        local_fc0 = local_fc0 + 4;
        local_fc8 = local_fc8 + 4;
        local_fd0 = local_fd0 + 4;
        local_fd8 = local_fd8 + 4;
      }
      local_fb8 = (undefined8 *)((long)local_fb8 + (long)iVar7 * 4);
      local_fc0 = (undefined8 *)((long)local_fc0 + (long)iVar7 * 4);
      local_fc8 = (undefined8 *)((long)local_fc8 + (long)iVar7 * 4);
      local_fd0 = (undefined8 *)((long)local_fd0 + (long)iVar7 * 4);
      local_fd8 = (undefined8 *)((long)local_fd8 + (long)iVar7 * 4);
    }
  }
  return;
}

Assistant:

static void convdw5x5s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out;

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4 * 2;
                r1 += 4 * 2;
                r2 += 4 * 2;
                r3 += 4 * 2;
                r4 += 4 * 2;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}